

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  initializer_list<float> __l_12;
  initializer_list<float> __l_13;
  initializer_list<float> __l_14;
  initializer_list<float> __l_15;
  initializer_list<float> __l_16;
  initializer_list<float> __l_17;
  initializer_list<float> __l_18;
  initializer_list<float> __l_19;
  initializer_list<float> __l_20;
  initializer_list<float> __l_21;
  initializer_list<float> __l_22;
  initializer_list<float> __l_23;
  initializer_list<float> __l_24;
  initializer_list<float> __l_25;
  initializer_list<float> __l_26;
  initializer_list<float> __l_27;
  initializer_list<float> __l_28;
  initializer_list<float> __l_29;
  initializer_list<float> __l_30;
  initializer_list<float> __l_31;
  initializer_list<float> __l_32;
  initializer_list<float> __l_33;
  initializer_list<float> __l_34;
  initializer_list<float> __l_35;
  initializer_list<float> __l_36;
  initializer_list<float> __l_37;
  initializer_list<float> __l_38;
  initializer_list<float> __l_39;
  initializer_list<float> __l_40;
  initializer_list<float> __l_41;
  initializer_list<float> __l_42;
  initializer_list<float> __l_43;
  initializer_list<float> __l_44;
  initializer_list<float> __l_45;
  initializer_list<float> __l_46;
  initializer_list<float> __l_47;
  initializer_list<float> __l_48;
  initializer_list<float> __l_49;
  initializer_list<float> __l_50;
  initializer_list<float> __l_51;
  initializer_list<float> __l_52;
  initializer_list<float> __l_53;
  initializer_list<float> __l_54;
  initializer_list<float> __l_55;
  initializer_list<float> __l_56;
  initializer_list<float> __l_57;
  initializer_list<float> __l_58;
  initializer_list<float> __l_59;
  initializer_list<float> __l_60;
  initializer_list<float> __l_61;
  initializer_list<float> __l_62;
  initializer_list<float> __l_63;
  initializer_list<float> __l_64;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_65;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffecc0;
  allocator_type *in_stack_ffffffffffffecd8;
  undefined8 ***pppuVar1;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffece0;
  undefined8 ***pppuVar2;
  iterator in_stack_ffffffffffffece8;
  size_type in_stack_ffffffffffffecf0;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffee68;
  undefined1 uVar4;
  string *in_stack_ffffffffffffee70;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *sequence;
  undefined1 local_edb;
  undefined1 local_eda;
  undefined4 local_ed8;
  undefined4 local_ed4;
  undefined4 *local_ed0;
  undefined8 local_ec8;
  undefined4 local_ebc;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 *local_eb0;
  undefined8 local_ea8;
  undefined4 local_e9c;
  undefined4 local_e98;
  undefined4 local_e94;
  undefined4 *local_e90;
  undefined8 local_e88;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 *local_e70;
  undefined8 local_e68;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined4 local_e54;
  undefined4 *local_e50;
  undefined8 local_e48;
  undefined4 local_e3c;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 *local_e30;
  undefined8 local_e28;
  undefined4 local_e1c;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 *local_e10;
  undefined8 local_e08;
  undefined4 local_dfc;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 *local_df0;
  undefined8 local_de8;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined4 local_dd4;
  undefined4 *local_dd0;
  undefined8 local_dc8;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 *local_db0;
  undefined8 local_da8;
  undefined4 local_d9c;
  undefined4 local_d98;
  undefined4 local_d94;
  undefined4 *local_d90;
  undefined8 local_d88;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 *local_d70;
  undefined8 local_d68;
  undefined4 local_d5c;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 *local_d50;
  undefined8 local_d48;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 *local_d30;
  undefined8 local_d28;
  undefined4 local_d1c;
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 *local_d10;
  undefined8 local_d08;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 *local_cf0;
  undefined8 local_ce8;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 *local_cd0;
  undefined8 local_cc8;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 *local_cb0;
  undefined8 local_ca8;
  undefined4 local_c9c;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined4 *local_c90;
  undefined8 local_c88;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 *local_c70;
  undefined8 local_c68;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 *local_c50;
  undefined8 local_c48;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 *local_c30;
  undefined8 local_c28;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 *local_c10;
  undefined8 local_c08;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 *local_bf0;
  undefined8 local_be8;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 *local_bd0;
  undefined8 local_bc8;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 *local_bb0;
  undefined8 local_ba8;
  undefined1 local_b9d [33];
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 *local_b70;
  undefined8 local_b68;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 *local_b50;
  undefined8 local_b48;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 *local_b30;
  undefined8 local_b28;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 *local_b10;
  undefined8 local_b08;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 *local_af0;
  undefined8 local_ae8;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 *local_ad0;
  undefined8 local_ac8;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 *local_ab0;
  undefined8 local_aa8;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 *local_a90;
  undefined8 local_a88;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 *local_a70;
  undefined8 local_a68;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 *local_a50;
  undefined8 local_a48;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 *local_a30;
  undefined8 local_a28;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 *local_a10;
  undefined8 local_a08;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 *local_9f0;
  undefined8 local_9e8;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 *local_9d0;
  undefined8 local_9c8;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 *local_9b0;
  undefined8 local_9a8;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 *local_990;
  undefined8 local_988;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 *local_970;
  undefined8 local_968;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 *local_950;
  undefined8 local_948;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 *local_930;
  undefined8 local_928;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 *local_910;
  undefined8 local_908;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 *local_8f0;
  undefined8 local_8e8;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 *local_8d0;
  undefined8 local_8c8;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 *local_8b0;
  undefined8 local_8a8;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 *local_890;
  undefined8 local_888;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 *local_870;
  undefined8 local_868;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 *local_850;
  undefined8 local_848;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 *local_830;
  undefined8 local_828;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 *local_810;
  undefined8 local_808;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 *local_7f0;
  undefined8 local_7e8;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 *local_7d0;
  undefined8 local_7c8;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 *local_7b0;
  undefined8 local_7a8;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 *local_790;
  undefined8 local_788;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 *local_770;
  undefined8 local_768;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 *local_750;
  undefined8 local_748;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 *local_730;
  undefined8 local_728;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 *local_710;
  undefined8 local_708;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 *local_6f0;
  undefined8 local_6e8;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 *local_6d0;
  undefined8 local_6c8;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 *local_6b0;
  undefined8 local_6a8;
  undefined8 **local_6a0;
  undefined1 **local_698 [3];
  undefined1 local_680 [24];
  undefined1 local_668 [24];
  undefined1 local_650 [24];
  undefined1 local_638 [24];
  undefined1 local_620 [24];
  undefined1 local_608 [24];
  undefined1 local_5f0 [24];
  undefined1 local_5d8 [24];
  undefined1 local_5c0 [24];
  undefined1 local_5a8 [24];
  undefined1 local_590 [24];
  undefined1 local_578 [24];
  undefined1 local_560 [24];
  undefined1 local_548 [24];
  undefined1 local_530 [24];
  undefined1 local_518 [24];
  undefined1 local_500 [24];
  undefined1 local_4e8 [24];
  undefined1 local_4d0 [24];
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [24];
  undefined1 local_488 [24];
  undefined1 local_470 [24];
  undefined1 local_458 [24];
  undefined1 local_440 [24];
  undefined1 local_428 [24];
  undefined1 local_410 [24];
  undefined1 local_3f8 [24];
  undefined1 local_3e0 [24];
  undefined1 local_3c8 [24];
  undefined1 local_3b0 [24];
  undefined1 local_398 [24];
  undefined1 local_380 [24];
  undefined1 local_368 [24];
  undefined1 local_350 [24];
  undefined1 local_338 [24];
  undefined1 local_320 [24];
  undefined1 local_308 [24];
  undefined1 local_2f0 [24];
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [24];
  undefined1 local_290 [24];
  undefined1 local_278 [24];
  undefined1 local_260 [24];
  undefined1 local_248 [24];
  undefined1 local_230 [24];
  undefined1 local_218 [24];
  undefined1 local_200 [24];
  undefined1 local_1e8 [24];
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  undefined1 local_188 [24];
  undefined1 local_170 [24];
  undefined1 local_158 [24];
  undefined1 local_140 [24];
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined8 **local_68;
  undefined8 local_60;
  allocator local_29;
  string local_28 [36];
  int local_4;
  
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffee68 >> 0x38);
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Hello, I am Robot!",&local_29);
  ev3dev::sound::speak(in_stack_ffffffffffffee70,(bool)uVar4);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_eda = 1;
  local_6a0 = local_698;
  local_6bc = 0x43c40000;
  local_6b8 = 0x43af0000;
  local_6b4 = 0x42c80000;
  local_6b0 = &local_6bc;
  local_6a8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1213f5);
  __l._M_len = in_stack_ffffffffffffecf0;
  __l._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_680;
  local_6dc = 0x43c40000;
  local_6d8 = 0x43af0000;
  local_6d4 = 0x42c80000;
  local_6d0 = &local_6dc;
  local_6c8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121486);
  __l_00._M_len = in_stack_ffffffffffffecf0;
  __l_00._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_00,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_668;
  local_6fc = 0x43c40000;
  local_6f8 = 0x43af0000;
  local_6f4 = 0x42c80000;
  local_6f0 = &local_6fc;
  local_6e8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121517);
  __l_01._M_len = in_stack_ffffffffffffecf0;
  __l_01._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_01,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_650;
  local_71c = 0x439b8ccd;
  local_718 = 0x437a0000;
  local_714 = 0x42c80000;
  local_710 = &local_71c;
  local_708 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1215a8);
  __l_02._M_len = in_stack_ffffffffffffecf0;
  __l_02._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_02,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_638;
  local_73c = 0x43e9199a;
  local_738 = 0x41c80000;
  local_734 = 0x42c80000;
  local_730 = &local_73c;
  local_728 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121639);
  __l_03._M_len = in_stack_ffffffffffffecf0;
  __l_03._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_03,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_620;
  local_75c = 0x43c40000;
  local_758 = 0x43af0000;
  local_754 = 0x42c80000;
  local_750 = &local_75c;
  local_748 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1216ca);
  __l_04._M_len = in_stack_ffffffffffffecf0;
  __l_04._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_04,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_608;
  local_77c = 0x439b8ccd;
  local_778 = 0x437a0000;
  local_774 = 0x42c80000;
  local_770 = &local_77c;
  local_768 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12175b);
  __l_05._M_len = in_stack_ffffffffffffecf0;
  __l_05._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_05,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_5f0;
  local_79c = 0x43e9199a;
  local_798 = 0x41c80000;
  local_794 = 0x42c80000;
  local_790 = &local_79c;
  local_788 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1217ec);
  __l_06._M_len = in_stack_ffffffffffffecf0;
  __l_06._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_06,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_5d8;
  local_7bc = 0x43c40000;
  local_7b8 = 0x442f0000;
  local_7b4 = 0x42c80000;
  local_7b0 = &local_7bc;
  local_7a8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12187d);
  __l_07._M_len = in_stack_ffffffffffffecf0;
  __l_07._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_07,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_5c0;
  local_7dc = 0x4412d47b;
  local_7d8 = 0x43af0000;
  local_7d4 = 0x42c80000;
  local_7d0 = &local_7dc;
  local_7c8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12190e);
  __l_08._M_len = in_stack_ffffffffffffecf0;
  __l_08._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_08,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_5a8;
  local_7fc = 0x4412d47b;
  local_7f8 = 0x43af0000;
  local_7f4 = 0x42c80000;
  local_7f0 = &local_7fc;
  local_7e8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12199f);
  __l_09._M_len = in_stack_ffffffffffffecf0;
  __l_09._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_09,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_590;
  local_81c = 0x4412d47b;
  local_818 = 0x43af0000;
  local_814 = 0x42c80000;
  local_810 = &local_81c;
  local_808 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121a30);
  __l_10._M_len = in_stack_ffffffffffffecf0;
  __l_10._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_10,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_578;
  local_83c = 0x441b90a4;
  local_838 = 0x437a0000;
  local_834 = 0x42c80000;
  local_830 = &local_83c;
  local_828 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121ac1);
  __l_11._M_len = in_stack_ffffffffffffecf0;
  __l_11._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_11,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_560;
  local_85c = 0x43e9199a;
  local_858 = 0x41c80000;
  local_854 = 0x42c80000;
  local_850 = &local_85c;
  local_848 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121b52);
  __l_12._M_len = in_stack_ffffffffffffecf0;
  __l_12._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_12,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_548;
  local_87c = 0x43b8feb8;
  local_878 = 0x43af0000;
  local_874 = 0x42c80000;
  local_870 = &local_87c;
  local_868 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121be3);
  __l_13._M_len = in_stack_ffffffffffffecf0;
  __l_13._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_13,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_530;
  local_89c = 0x439b8ccd;
  local_898 = 0x437a0000;
  local_894 = 0x42c80000;
  local_890 = &local_89c;
  local_888 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121c74);
  __l_14._M_len = in_stack_ffffffffffffecf0;
  __l_14._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_14,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_518;
  local_8bc = 0x43e9199a;
  local_8b8 = 0x41c80000;
  local_8b4 = 0x42c80000;
  local_8b0 = &local_8bc;
  local_8a8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121d05);
  __l_15._M_len = in_stack_ffffffffffffecf0;
  __l_15._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_15,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_500;
  local_8dc = 0x43c40000;
  local_8d8 = 0x442f0000;
  local_8d4 = 0x42c80000;
  local_8d0 = &local_8dc;
  local_8c8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121d96);
  __l_16._M_len = in_stack_ffffffffffffecf0;
  __l_16._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_16,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_4e8;
  local_8fc = 0x44440000;
  local_8f8 = 0x43af0000;
  local_8f4 = 0x42c80000;
  local_8f0 = &local_8fc;
  local_8e8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121e27);
  __l_17._M_len = in_stack_ffffffffffffecf0;
  __l_17._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_17,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_4d0;
  local_91c = 0x43c40000;
  local_918 = 0x437a0000;
  local_914 = 0x42c80000;
  local_910 = &local_91c;
  local_908 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121eb8);
  __l_18._M_len = in_stack_ffffffffffffecf0;
  __l_18._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_18,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_4b8;
  local_93c = 0x43c40000;
  local_938 = 0x41c80000;
  local_934 = 0x42c80000;
  local_930 = &local_93c;
  local_928 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121f49);
  __l_19._M_len = in_stack_ffffffffffffecf0;
  __l_19._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_19,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_4a0;
  local_95c = 0x44440000;
  local_958 = 0x43af0000;
  local_954 = 0x42c80000;
  local_950 = &local_95c;
  local_948 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x121fda);
  __l_20._M_len = in_stack_ffffffffffffecf0;
  __l_20._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_20,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_488;
  local_97c = 0x4438feb8;
  local_978 = 0x437a0000;
  local_974 = 0x42c80000;
  local_970 = &local_97c;
  local_968 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12206b);
  __l_21._M_len = in_stack_ffffffffffffecf0;
  __l_21._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_21,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_470;
  local_99c = 0x442e9d71;
  local_998 = 0x41c80000;
  local_994 = 0x42c80000;
  local_990 = &local_99c;
  local_988 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1220fc);
  __l_22._M_len = in_stack_ffffffffffffecf0;
  __l_22._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_22,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_458;
  local_9bc = 0x4424d0a4;
  local_9b8 = 0x41c80000;
  local_9b4 = 0x42c80000;
  local_9b0 = &local_9bc;
  local_9a8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12218d);
  __l_23._M_len = in_stack_ffffffffffffecf0;
  __l_23._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_23,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_440;
  local_9dc = 0x441b90a4;
  local_9d8 = 0x41c80000;
  local_9d4 = 0x42c80000;
  local_9d0 = &local_9dc;
  local_9c8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12221e);
  __l_24._M_len = in_stack_ffffffffffffecf0;
  __l_24._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_24,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_428;
  local_9fc = 0x4424d0a4;
  local_9f8 = 0x42480000;
  local_9f4 = 0x43c80000;
  local_9f0 = &local_9fc;
  local_9e8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1222af);
  __l_25._M_len = in_stack_ffffffffffffecf0;
  __l_25._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_25,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_410;
  local_a1c = 0x43cfa666;
  local_a18 = 0x41c80000;
  local_a14 = 0x43480000;
  local_a10 = &local_a1c;
  local_a08 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122340);
  __l_26._M_len = in_stack_ffffffffffffecf0;
  __l_26._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_26,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_3f8;
  local_a3c = 0x440a970a;
  local_a38 = 0x43af0000;
  local_a34 = 0x42c80000;
  local_a30 = &local_a3c;
  local_a28 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1223d1);
  __l_27._M_len = in_stack_ffffffffffffecf0;
  __l_27._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_27,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_3e0;
  local_a5c = 0x4402d000;
  local_a58 = 0x437a0000;
  local_a54 = 0x42c80000;
  local_a50 = &local_a5c;
  local_a48 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122462);
  __l_28._M_len = in_stack_ffffffffffffecf0;
  __l_28._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_28,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_3c8;
  local_a7c = 0x43f6f0a4;
  local_a78 = 0x41c80000;
  local_a74 = 0x42c80000;
  local_a70 = &local_a7c;
  local_a68 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1224f3);
  __l_29._M_len = in_stack_ffffffffffffecf0;
  __l_29._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_29,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_3b0;
  local_a9c = 0x43e9147b;
  local_a98 = 0x41c80000;
  local_a94 = 0x42c80000;
  local_a90 = &local_a9c;
  local_a88 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122584);
  __l_30._M_len = in_stack_ffffffffffffecf0;
  __l_30._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_30,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_398;
  local_abc = 0x43dc0000;
  local_ab8 = 0x41c80000;
  local_ab4 = 0x42c80000;
  local_ab0 = &local_abc;
  local_aa8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122615);
  __l_31._M_len = in_stack_ffffffffffffecf0;
  __l_31._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_31,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_380;
  local_adc = 0x43e9147b;
  local_ad8 = 0x42480000;
  local_ad4 = 0x43c80000;
  local_ad0 = &local_adc;
  local_ac8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1226a6);
  __l_32._M_len = in_stack_ffffffffffffecf0;
  __l_32._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_32,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_368;
  local_afc = 0x439b90a4;
  local_af8 = 0x41c80000;
  local_af4 = 0x43480000;
  local_af0 = &local_afc;
  local_ae8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122737);
  __l_33._M_len = in_stack_ffffffffffffecf0;
  __l_33._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_33,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_350;
  local_b1c = 0x43b8feb8;
  local_b18 = 0x43af0000;
  local_b14 = 0x42c80000;
  local_b10 = &local_b1c;
  local_b08 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1227c8);
  __l_34._M_len = in_stack_ffffffffffffecf0;
  __l_34._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_34,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_338;
  local_b3c = 0x439b90a4;
  local_b38 = 0x437a0000;
  local_b34 = 0x42c80000;
  local_b30 = &local_b3c;
  local_b28 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122859);
  __l_35._M_len = in_stack_ffffffffffffecf0;
  __l_35._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_35,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_320;
  local_b5c = 0x43c40000;
  local_b58 = 0x41c80000;
  local_b54 = 0x42c80000;
  local_b50 = &local_b5c;
  local_b48 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1228ea);
  __l_36._M_len = in_stack_ffffffffffffecf0;
  __l_36._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_36,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_308;
  local_b7c = 0x43e9147b;
  local_b78 = 0x43af0000;
  local_b74 = 0x42c80000;
  local_b70 = &local_b7c;
  local_b68 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12297b);
  __l_37._M_len = in_stack_ffffffffffffecf0;
  __l_37._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_37,(allocator_type *)in_stack_ffffffffffffecd8);
  puVar3 = local_2f0;
  local_b9d._1_4_ = 0x43c40000;
  local_b9d._5_4_ = 0x437a0000;
  local_b9d._9_4_ = 0x42c80000;
  local_b9d._13_8_ = local_b9d + 1;
  local_b9d._21_8_ = 3;
  sequence = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)local_b9d;
  local_6a0 = (undefined8 **)puVar3;
  std::allocator<float>::allocator((allocator<float> *)0x122a0c);
  uVar4 = (undefined1)((ulong)puVar3 >> 0x38);
  __l_38._M_len = in_stack_ffffffffffffecf0;
  __l_38._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_38,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_2d8;
  local_bbc = 0x43e9147b;
  local_bb8 = 0x41c80000;
  local_bb4 = 0x42c80000;
  local_bb0 = &local_bbc;
  local_ba8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122a9d);
  __l_39._M_len = in_stack_ffffffffffffecf0;
  __l_39._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_39,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_2c0;
  local_bdc = 0x4412d47b;
  local_bd8 = 0x442f0000;
  local_bd4 = 0x42c80000;
  local_bd0 = &local_bdc;
  local_bc8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122b2e);
  __l_40._M_len = in_stack_ffffffffffffecf0;
  __l_40._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_40,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_2a8;
  local_bfc = 0x44440000;
  local_bf8 = 0x43af0000;
  local_bf4 = 0x42c80000;
  local_bf0 = &local_bfc;
  local_be8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122bbf);
  __l_41._M_len = in_stack_ffffffffffffecf0;
  __l_41._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_41,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_290;
  local_c1c = 0x43c40000;
  local_c18 = 0x437a0000;
  local_c14 = 0x42c80000;
  local_c10 = &local_c1c;
  local_c08 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122c50);
  __l_42._M_len = in_stack_ffffffffffffecf0;
  __l_42._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_42,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_278;
  local_c3c = 0x43c40000;
  local_c38 = 0x41c80000;
  local_c34 = 0x42c80000;
  local_c30 = &local_c3c;
  local_c28 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122ce1);
  __l_43._M_len = in_stack_ffffffffffffecf0;
  __l_43._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_43,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_260;
  local_c5c = 0x44440000;
  local_c58 = 0x43af0000;
  local_c54 = 0x42c80000;
  local_c50 = &local_c5c;
  local_c48 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122d72);
  __l_44._M_len = in_stack_ffffffffffffecf0;
  __l_44._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_44,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_248;
  local_c7c = 0x4438feb8;
  local_c78 = 0x437a0000;
  local_c74 = 0x42c80000;
  local_c70 = &local_c7c;
  local_c68 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122e03);
  __l_45._M_len = in_stack_ffffffffffffecf0;
  __l_45._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_45,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_230;
  local_c9c = 0x442e9d71;
  local_c98 = 0x41c80000;
  local_c94 = 0x42c80000;
  local_c90 = &local_c9c;
  local_c88 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122e94);
  __l_46._M_len = in_stack_ffffffffffffecf0;
  __l_46._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_46,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_218;
  local_cbc = 0x4424d0a4;
  local_cb8 = 0x41c80000;
  local_cb4 = 0x42c80000;
  local_cb0 = &local_cbc;
  local_ca8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122f25);
  __l_47._M_len = in_stack_ffffffffffffecf0;
  __l_47._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_47,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_200;
  local_cdc = 0x441b90a4;
  local_cd8 = 0x41c80000;
  local_cd4 = 0x42c80000;
  local_cd0 = &local_cdc;
  local_cc8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x122fb6);
  __l_48._M_len = in_stack_ffffffffffffecf0;
  __l_48._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_48,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_1e8;
  local_cfc = 0x4424d0a4;
  local_cf8 = 0x42480000;
  local_cf4 = 0x43c80000;
  local_cf0 = &local_cfc;
  local_ce8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123047);
  __l_49._M_len = in_stack_ffffffffffffecf0;
  __l_49._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_49,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_1d0;
  local_d1c = 0x43cfa666;
  local_d18 = 0x41c80000;
  local_d14 = 0x43480000;
  local_d10 = &local_d1c;
  local_d08 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1230d8);
  __l_50._M_len = in_stack_ffffffffffffecf0;
  __l_50._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_50,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_1b8;
  local_d3c = 0x440a970a;
  local_d38 = 0x43af0000;
  local_d34 = 0x42c80000;
  local_d30 = &local_d3c;
  local_d28 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123169);
  __l_51._M_len = in_stack_ffffffffffffecf0;
  __l_51._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_51,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_1a0;
  local_d5c = 0x4402d000;
  local_d58 = 0x437a0000;
  local_d54 = 0x42c80000;
  local_d50 = &local_d5c;
  local_d48 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1231fa);
  __l_52._M_len = in_stack_ffffffffffffecf0;
  __l_52._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_52,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_188;
  local_d7c = 0x43f6f0a4;
  local_d78 = 0x41c80000;
  local_d74 = 0x42c80000;
  local_d70 = &local_d7c;
  local_d68 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12328b);
  __l_53._M_len = in_stack_ffffffffffffecf0;
  __l_53._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_53,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_170;
  local_d9c = 0x43e9147b;
  local_d98 = 0x41c80000;
  local_d94 = 0x42c80000;
  local_d90 = &local_d9c;
  local_d88 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12331c);
  __l_54._M_len = in_stack_ffffffffffffecf0;
  __l_54._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_54,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_158;
  local_dbc = 0x43dc0000;
  local_db8 = 0x41c80000;
  local_db4 = 0x42c80000;
  local_db0 = &local_dbc;
  local_da8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1233ad);
  __l_55._M_len = in_stack_ffffffffffffecf0;
  __l_55._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_55,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_140;
  local_ddc = 0x43e9147b;
  local_dd8 = 0x42480000;
  local_dd4 = 0x43c80000;
  local_dd0 = &local_ddc;
  local_dc8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12343e);
  __l_56._M_len = in_stack_ffffffffffffecf0;
  __l_56._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_56,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_128;
  local_dfc = 0x439b90a4;
  local_df8 = 0x41c80000;
  local_df4 = 0x43480000;
  local_df0 = &local_dfc;
  local_de8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1234cf);
  __l_57._M_len = in_stack_ffffffffffffecf0;
  __l_57._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_57,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_110;
  local_e1c = 0x43c40000;
  local_e18 = 0x43af0000;
  local_e14 = 0x42c80000;
  local_e10 = &local_e1c;
  local_e08 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123560);
  __l_58._M_len = in_stack_ffffffffffffecf0;
  __l_58._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_58,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_f8;
  local_e3c = 0x439b90a4;
  local_e38 = 0x437a0000;
  local_e34 = 0x42c80000;
  local_e30 = &local_e3c;
  local_e28 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1235f1);
  __l_59._M_len = in_stack_ffffffffffffecf0;
  __l_59._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_59,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_e0;
  local_e5c = 0x43e9147b;
  local_e58 = 0x41c80000;
  local_e54 = 0x42c80000;
  local_e50 = &local_e5c;
  local_e48 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123682);
  __l_60._M_len = in_stack_ffffffffffffecf0;
  __l_60._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_60,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_c8;
  local_e7c = 0x43c40000;
  local_e78 = 0x43960000;
  local_e74 = 0x43160000;
  local_e70 = &local_e7c;
  local_e68 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123713);
  __l_61._M_len = in_stack_ffffffffffffecf0;
  __l_61._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_61,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_b0;
  local_e9c = 0x439b90a4;
  local_e98 = 0x437a0000;
  local_e94 = 0x42c80000;
  local_e90 = &local_e9c;
  local_e88 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x12379e);
  __l_62._M_len = in_stack_ffffffffffffecf0;
  __l_62._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_62,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_98;
  local_ebc = 0x43e9147b;
  local_eb8 = 0x41c80000;
  local_eb4 = 0x42c80000;
  local_eb0 = &local_ebc;
  local_ea8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x123823);
  __l_63._M_len = in_stack_ffffffffffffecf0;
  __l_63._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_63,(allocator_type *)in_stack_ffffffffffffecd8);
  local_6a0 = (undefined8 **)local_80;
  local_ed8 = 0x43c40000;
  local_ed4 = 0x442f0000;
  local_ed0 = &local_ed8;
  local_ec8 = 2;
  std::allocator<float>::allocator((allocator<float> *)0x12389d);
  __l_64._M_len = in_stack_ffffffffffffecf0;
  __l_64._M_array = (iterator)in_stack_ffffffffffffece8;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffece0,__l_64,(allocator_type *)in_stack_ffffffffffffecd8);
  local_eda = 0;
  local_68 = local_698;
  local_60 = 0x42;
  puVar3 = &local_edb;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1238f4);
  __l_65._M_len = (size_type)puVar3;
  __l_65._M_array = in_stack_ffffffffffffece8;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)in_stack_ffffffffffffece0,__l_65,in_stack_ffffffffffffecd8);
  ev3dev::sound::tone(sequence,(bool)uVar4);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)in_stack_ffffffffffffecc0);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x123946);
  pppuVar2 = (undefined8 ***)local_698;
  pppuVar1 = &local_68;
  do {
    pppuVar1 = pppuVar1 + -3;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffecc0);
  } while (pppuVar1 != pppuVar2);
  std::allocator<float>::~allocator((allocator<float> *)0x123992);
  std::allocator<float>::~allocator((allocator<float> *)0x12399f);
  std::allocator<float>::~allocator((allocator<float> *)0x1239ac);
  std::allocator<float>::~allocator((allocator<float> *)0x1239b9);
  std::allocator<float>::~allocator((allocator<float> *)0x1239c6);
  std::allocator<float>::~allocator((allocator<float> *)0x1239d3);
  std::allocator<float>::~allocator((allocator<float> *)0x1239e0);
  std::allocator<float>::~allocator((allocator<float> *)0x1239ed);
  std::allocator<float>::~allocator((allocator<float> *)0x1239fa);
  std::allocator<float>::~allocator((allocator<float> *)0x123a07);
  std::allocator<float>::~allocator((allocator<float> *)0x123a14);
  std::allocator<float>::~allocator((allocator<float> *)0x123a21);
  std::allocator<float>::~allocator((allocator<float> *)0x123a2e);
  std::allocator<float>::~allocator((allocator<float> *)0x123a3b);
  std::allocator<float>::~allocator((allocator<float> *)0x123a48);
  std::allocator<float>::~allocator((allocator<float> *)0x123a55);
  std::allocator<float>::~allocator((allocator<float> *)0x123a62);
  std::allocator<float>::~allocator((allocator<float> *)0x123a6f);
  std::allocator<float>::~allocator((allocator<float> *)0x123a7c);
  std::allocator<float>::~allocator((allocator<float> *)0x123a89);
  std::allocator<float>::~allocator((allocator<float> *)0x123a96);
  std::allocator<float>::~allocator((allocator<float> *)0x123aa3);
  std::allocator<float>::~allocator((allocator<float> *)0x123ab0);
  std::allocator<float>::~allocator((allocator<float> *)0x123abd);
  std::allocator<float>::~allocator((allocator<float> *)0x123aca);
  std::allocator<float>::~allocator((allocator<float> *)0x123ad7);
  std::allocator<float>::~allocator((allocator<float> *)0x123ae4);
  std::allocator<float>::~allocator((allocator<float> *)0x123af1);
  std::allocator<float>::~allocator((allocator<float> *)0x123afe);
  std::allocator<float>::~allocator((allocator<float> *)0x123b0b);
  std::allocator<float>::~allocator((allocator<float> *)0x123b18);
  std::allocator<float>::~allocator((allocator<float> *)0x123b25);
  std::allocator<float>::~allocator((allocator<float> *)0x123b32);
  std::allocator<float>::~allocator((allocator<float> *)0x123b3f);
  std::allocator<float>::~allocator((allocator<float> *)0x123b4c);
  std::allocator<float>::~allocator((allocator<float> *)0x123b59);
  std::allocator<float>::~allocator((allocator<float> *)0x123b66);
  std::allocator<float>::~allocator((allocator<float> *)0x123b73);
  std::allocator<float>::~allocator((allocator<float> *)0x123b80);
  std::allocator<float>::~allocator((allocator<float> *)0x123b8d);
  std::allocator<float>::~allocator((allocator<float> *)0x123b9a);
  std::allocator<float>::~allocator((allocator<float> *)0x123ba7);
  std::allocator<float>::~allocator((allocator<float> *)0x123bb4);
  std::allocator<float>::~allocator((allocator<float> *)0x123bc1);
  std::allocator<float>::~allocator((allocator<float> *)0x123bce);
  std::allocator<float>::~allocator((allocator<float> *)0x123bdb);
  std::allocator<float>::~allocator((allocator<float> *)0x123be8);
  std::allocator<float>::~allocator((allocator<float> *)0x123bf5);
  std::allocator<float>::~allocator((allocator<float> *)0x123c02);
  std::allocator<float>::~allocator((allocator<float> *)0x123c0f);
  std::allocator<float>::~allocator((allocator<float> *)0x123c1c);
  std::allocator<float>::~allocator((allocator<float> *)0x123c29);
  std::allocator<float>::~allocator((allocator<float> *)0x123c36);
  std::allocator<float>::~allocator((allocator<float> *)0x123c43);
  std::allocator<float>::~allocator((allocator<float> *)0x123c50);
  std::allocator<float>::~allocator((allocator<float> *)0x123c5d);
  std::allocator<float>::~allocator((allocator<float> *)0x123c6a);
  std::allocator<float>::~allocator((allocator<float> *)0x123c77);
  std::allocator<float>::~allocator((allocator<float> *)0x123c84);
  std::allocator<float>::~allocator((allocator<float> *)0x123c91);
  std::allocator<float>::~allocator((allocator<float> *)0x123c9e);
  std::allocator<float>::~allocator((allocator<float> *)0x123cab);
  std::allocator<float>::~allocator((allocator<float> *)0x123cb8);
  std::allocator<float>::~allocator((allocator<float> *)0x123cc5);
  std::allocator<float>::~allocator((allocator<float> *)0x123cd2);
  std::allocator<float>::~allocator((allocator<float> *)0x123cdf);
  return local_4;
}

Assistant:

int main() {
    sound::speak("Hello, I am Robot!", true);
    sound::tone({
            {392, 350, 100}, {392, 350, 100}, {392, 350, 100}, {311.1, 250, 100},
            {466.2, 25, 100}, {392, 350, 100}, {311.1, 250, 100}, {466.2, 25, 100},
            {392, 700, 100}, {587.32, 350, 100}, {587.32, 350, 100},
            {587.32, 350, 100}, {622.26, 250, 100}, {466.2, 25, 100},
            {369.99, 350, 100}, {311.1, 250, 100}, {466.2, 25, 100}, {392, 700, 100},
            {784, 350, 100}, {392, 250, 100}, {392, 25, 100}, {784, 350, 100},
            {739.98, 250, 100}, {698.46, 25, 100}, {659.26, 25, 100},
            {622.26, 25, 100}, {659.26, 50, 400}, {415.3, 25, 200}, {554.36, 350, 100},
            {523.25, 250, 100}, {493.88, 25, 100}, {466.16, 25, 100}, {440, 25, 100},
            {466.16, 50, 400}, {311.13, 25, 200}, {369.99, 350, 100},
            {311.13, 250, 100}, {392, 25, 100}, {466.16, 350, 100}, {392, 250, 100},
            {466.16, 25, 100}, {587.32, 700, 100}, {784, 350, 100}, {392, 250, 100},
            {392, 25, 100}, {784, 350, 100}, {739.98, 250, 100}, {698.46, 25, 100},
            {659.26, 25, 100}, {622.26, 25, 100}, {659.26, 50, 400}, {415.3, 25, 200},
            {554.36, 350, 100}, {523.25, 250, 100}, {493.88, 25, 100},
            {466.16, 25, 100}, {440, 25, 100}, {466.16, 50, 400}, {311.13, 25, 200},
            {392, 350, 100}, {311.13, 250, 100}, {466.16, 25, 100},
            {392.00, 300, 150}, {311.13, 250, 100}, {466.16, 25, 100}, {392, 700}
            },
            true
            );
}